

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCBoolean.cpp
# Opt level: O1

void Assimp::IFC::ProcessBooleanHalfSpaceDifference
               (IfcHalfSpaceSolid *hs,TempMesh *result,TempMesh *first_operand,
               ConversionData *param_4)

{
  pointer *ppaVar1;
  pointer *ppuVar2;
  IfcVector3 *e0;
  double dVar3;
  double dVar4;
  double dVar5;
  pointer pcVar6;
  uint *puVar7;
  pointer paVar8;
  iterator iVar9;
  aiVector3t<double> *paVar10;
  iterator __position;
  TempMesh *pTVar11;
  bool bVar12;
  bool bVar13;
  int iVar14;
  IfcSurface *pIVar15;
  long lVar16;
  IfcAxis2Placement3D *pIVar17;
  IfcDirection *in;
  IfcCartesianPoint *in_00;
  ulong uVar18;
  __normal_iterator<aiVector3t<double>_*,_std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>_>
  _Var19;
  pointer paVar20;
  ulong uVar21;
  uint *puVar22;
  ulong uVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  char *unaff_retaddr;
  IfcVector3 isectpos;
  IfcVector3 e1;
  IfcVector3 p;
  uint local_ec;
  ulong local_e8;
  TempMesh *local_e0;
  IfcVector3 local_d8;
  IfcVector3 local_b8;
  undefined1 local_98 [8];
  _Alloc_hider _Stack_90;
  double local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  IfcVector3 local_68;
  vector<unsigned_int,std::allocator<unsigned_int>> *local_48;
  uint *local_40;
  FuzzyVectorCompare local_38;
  
  local_e0 = first_operand;
  if (hs == (IfcHalfSpaceSolid *)0x0) {
    __assert_fail("hs != __null",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Importer/IFC/IFCBoolean.cpp"
                  ,0x8f,
                  "void Assimp::IFC::ProcessBooleanHalfSpaceDifference(const Schema_2x3::IfcHalfSpaceSolid *, TempMesh &, const TempMesh &, ConversionData &)"
                 );
  }
  pIVar15 = STEP::LazyObject::To<Assimp::IFC::Schema_2x3::IfcSurface>
                      (*(LazyObject **)&(hs->super_IfcGeometricRepresentationItem).field_0x30);
  lVar16 = __dynamic_cast((_func_int *)
                          ((long)&(pIVar15->super_IfcGeometricRepresentationItem).
                                  super_IfcRepresentationItem.
                                  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>
                                  ._vptr_ObjectHelper +
                          (long)(pIVar15->super_IfcGeometricRepresentationItem).
                                super_IfcRepresentationItem.
                                super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>
                                ._vptr_ObjectHelper[-3]),&STEP::Object::typeinfo,
                          &Schema_2x3::IfcPlane::typeinfo,0xffffffffffffffff);
  if (lVar16 == 0) {
    LogFunctions<Assimp::IFCImporter>::LogError(unaff_retaddr);
    return;
  }
  local_68.x = 0.0;
  local_68.y = 0.0;
  local_68.z = 0.0;
  local_d8.x = 0.0;
  local_d8.y = 0.0;
  local_d8.z = 1.0;
  pIVar17 = STEP::LazyObject::To<Assimp::IFC::Schema_2x3::IfcAxis2Placement3D>
                      (*(LazyObject **)(lVar16 + 0x40));
  if (pIVar17->field_0x50 == '\x01') {
    pIVar17 = STEP::LazyObject::To<Assimp::IFC::Schema_2x3::IfcAxis2Placement3D>
                        (*(LazyObject **)(lVar16 + 0x40));
    if (pIVar17->field_0x50 == '\0') {
      __assert_fail("have",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/./code/Step/STEPFile.h"
                    ,0x240,
                    "const T &Assimp::STEP::Maybe<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcDirection>>::Get() const [T = Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcDirection>]"
                   );
    }
    in = STEP::LazyObject::To<Assimp::IFC::Schema_2x3::IfcDirection>
                   (*(LazyObject **)&(pIVar17->super_IfcPlacement).field_0x48);
    ConvertDirection(&local_d8,in);
  }
  pIVar17 = STEP::LazyObject::To<Assimp::IFC::Schema_2x3::IfcAxis2Placement3D>
                      (*(LazyObject **)(lVar16 + 0x40));
  in_00 = STEP::LazyObject::To<Assimp::IFC::Schema_2x3::IfcCartesianPoint>
                    (*(LazyObject **)
                      &(pIVar17->super_IfcPlacement).super_IfcGeometricRepresentationItem.field_0x30
                    );
  ConvertCartesianPoint(&local_68,in_00);
  local_98 = (undefined1  [8])&PTR__PrimitiveDataType_008f31f0;
  pcVar6 = (hs->AgreementFlag)._M_dataplus._M_p;
  _Stack_90._M_p = (pointer)&local_80;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&_Stack_90,pcVar6,pcVar6 + (hs->AgreementFlag)._M_string_length);
  local_98 = (undefined1  [8])&PTR__PrimitiveDataType_008f31b8;
  bVar12 = IsTrue((BOOLEAN *)local_98);
  local_98 = (undefined1  [8])&PTR__PrimitiveDataType_008f31f0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Stack_90._M_p != &local_80) {
    operator_delete(_Stack_90._M_p,local_80._M_allocated_capacity + 1);
  }
  pTVar11 = local_e0;
  if (!bVar12) {
    local_d8.x = -local_d8.x;
    local_d8.y = -local_d8.y;
    local_d8.z = -local_d8.z;
  }
  puVar22 = (local_e0->mVertcnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_start;
  puVar7 = (local_e0->mVertcnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::reserve
            (&result->mVerts,
             ((long)(local_e0->mVerts).
                    super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(local_e0->mVerts).
                    super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555);
  local_48 = (vector<unsigned_int,std::allocator<unsigned_int>> *)&result->mVertcnt;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_48,
             (long)(pTVar11->mVertcnt).
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(pTVar11->mVertcnt).
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start >> 2);
  local_40 = puVar7;
  if (puVar22 != puVar7) {
    local_e8 = 0;
    do {
      local_ec = 0;
      uVar18 = (ulong)*puVar22;
      if (*puVar22 != 0) {
        paVar8 = (local_e0->mVerts).
                 super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        bVar12 = -1e-06 < (paVar8[local_e8].z - local_68.z) * local_d8.z +
                          (paVar8[local_e8].x - local_68.x) * local_d8.x +
                          (paVar8[local_e8].y - local_68.y) * local_d8.y;
        uVar21 = 1;
        uVar23 = local_e8;
        do {
          iVar14 = 0;
          if (uVar21 != uVar18) {
            iVar14 = (int)uVar21;
          }
          paVar8 = (local_e0->mVerts).
                   super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          e0 = paVar8 + uVar23;
          local_88 = paVar8[(uint)(iVar14 + (int)local_e8)].z;
          local_98 = (undefined1  [8])paVar8[(uint)(iVar14 + (int)local_e8)].x;
          _Stack_90._M_p = (pointer)paVar8[(uint)(iVar14 + (int)local_e8)].y;
          local_b8.x = 0.0;
          local_b8.y = 0.0;
          local_b8.z = 0.0;
          bVar13 = IntersectSegmentPlane
                             (&local_68,&local_d8,e0,(IfcVector3 *)local_98,bVar12,&local_b8);
          if (bVar13) {
            if (bVar12 == false) {
              iVar9._M_current =
                   (result->mVerts).
                   super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
              if (iVar9._M_current ==
                  (result->mVerts).
                  super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage) {
                std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>::
                _M_realloc_insert<aiVector3t<double>const&>
                          ((vector<aiVector3t<double>,std::allocator<aiVector3t<double>>> *)result,
                           iVar9,&local_b8);
              }
              else {
                (iVar9._M_current)->z = local_b8.z;
                (iVar9._M_current)->x = local_b8.x;
                (iVar9._M_current)->y = local_b8.y;
                ppaVar1 = &(result->mVerts).
                           super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
                *ppaVar1 = *ppaVar1 + 1;
              }
              local_ec = local_ec + 1;
            }
            else {
              iVar9._M_current =
                   (result->mVerts).
                   super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
              if (iVar9._M_current ==
                  (result->mVerts).
                  super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage) {
                std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>::
                _M_realloc_insert<aiVector3t<double>const&>
                          ((vector<aiVector3t<double>,std::allocator<aiVector3t<double>>> *)result,
                           iVar9,e0);
              }
              else {
                (iVar9._M_current)->z = e0->z;
                dVar24 = e0->y;
                (iVar9._M_current)->x = e0->x;
                (iVar9._M_current)->y = dVar24;
                ppaVar1 = &(result->mVerts).
                           super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
                *ppaVar1 = *ppaVar1 + 1;
              }
              iVar9._M_current =
                   (result->mVerts).
                   super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
              if (iVar9._M_current ==
                  (result->mVerts).
                  super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage) {
                std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>::
                _M_realloc_insert<aiVector3t<double>const&>
                          ((vector<aiVector3t<double>,std::allocator<aiVector3t<double>>> *)result,
                           iVar9,&local_b8);
              }
              else {
                (iVar9._M_current)->z = local_b8.z;
                (iVar9._M_current)->x = local_b8.x;
                (iVar9._M_current)->y = local_b8.y;
                ppaVar1 = &(result->mVerts).
                           super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
                *ppaVar1 = *ppaVar1 + 1;
              }
              local_ec = local_ec + 2;
            }
            bVar12 = (bool)(bVar12 ^ 1);
          }
          else if (bVar12 != false) {
            iVar9._M_current =
                 (result->mVerts).
                 super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
            if (iVar9._M_current ==
                (result->mVerts).
                super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl
                .super__Vector_impl_data._M_end_of_storage) {
              std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>::
              _M_realloc_insert<aiVector3t<double>const&>
                        ((vector<aiVector3t<double>,std::allocator<aiVector3t<double>>> *)result,
                         iVar9,e0);
            }
            else {
              (iVar9._M_current)->z = e0->z;
              dVar24 = e0->y;
              (iVar9._M_current)->x = e0->x;
              (iVar9._M_current)->y = dVar24;
              ppaVar1 = &(result->mVerts).
                         super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
              *ppaVar1 = *ppaVar1 + 1;
            }
            local_ec = local_ec + 1;
          }
          uVar18 = (ulong)*puVar22;
          uVar23 = (ulong)((int)uVar23 + 1);
          bVar13 = uVar21 < uVar18;
          uVar21 = uVar21 + 1;
        } while (bVar13);
      }
      uVar18 = (ulong)local_ec;
      if (uVar18 != 0) {
        _Var19._M_current =
             (result->mVerts).
             super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
             super__Vector_impl_data._M_finish;
        lVar16 = 0;
        dVar29 = -10000000000.0;
        dVar24 = -10000000000.0;
        dVar25 = -10000000000.0;
        dVar28 = 10000000000.0;
        dVar26 = 10000000000.0;
        dVar27 = 10000000000.0;
        do {
          dVar3 = *(double *)((long)&_Var19._M_current[-uVar18].x + lVar16);
          dVar4 = *(double *)((long)&_Var19._M_current[-uVar18].y + lVar16);
          if (dVar3 <= dVar28) {
            dVar28 = dVar3;
          }
          if (dVar4 <= dVar27) {
            dVar27 = dVar4;
          }
          dVar5 = *(double *)((long)&_Var19._M_current[-uVar18].z + lVar16);
          if (dVar5 <= dVar26) {
            dVar26 = dVar5;
          }
          if (dVar29 <= dVar3) {
            dVar29 = dVar3;
          }
          if (dVar25 <= dVar4) {
            dVar25 = dVar4;
          }
          if (dVar24 <= dVar5) {
            dVar24 = dVar5;
          }
          lVar16 = lVar16 + 0x18;
        } while (uVar18 * 0x18 != lVar16);
        local_38.epsilon =
             ((dVar24 - dVar26) * (dVar24 - dVar26) +
             (dVar29 - dVar28) * (dVar29 - dVar28) + (dVar25 - dVar27) * (dVar25 - dVar27)) /
             1000000.0;
        _Var19 = std::
                 __unique<__gnu_cxx::__normal_iterator<aiVector3t<double>*,std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>>,__gnu_cxx::__ops::_Iter_comp_iter<Assimp::IFC::FuzzyVectorCompare>>
                           (_Var19._M_current + -uVar18,_Var19,
                            (_Iter_comp_iter<Assimp::IFC::FuzzyVectorCompare>)local_38.epsilon);
        paVar10 = (result->mVerts).
                  super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
        if (_Var19._M_current != paVar10) {
          local_ec = local_ec +
                     (int)((ulong)((long)paVar10 - (long)_Var19._M_current) >> 3) * 0x55555555;
          paVar8 = (result->mVerts).
                   super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
          paVar20 = (pointer)(((long)paVar8 - (long)paVar10) + (long)_Var19._M_current);
          if (paVar8 != paVar20) {
            (result->mVerts).
            super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
            super__Vector_impl_data._M_finish = paVar20;
          }
        }
        paVar8 = (result->mVerts).
                 super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        uVar18 = (ulong)local_ec;
        dVar24 = paVar8[-uVar18].x - paVar8[-1].x;
        dVar25 = paVar8[-uVar18].y - paVar8[-1].y;
        dVar26 = paVar8[-uVar18].z - paVar8[-1].z;
        if (ABS(dVar26 * dVar26 + dVar24 * dVar24 + dVar25 * dVar25) < local_38.epsilon) {
          (result->mVerts).
          super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
          super__Vector_impl_data._M_finish = paVar8 + -1;
          local_ec = local_ec - 1;
        }
        if (local_ec < 3) {
          bVar12 = local_ec != 0;
          local_ec = local_ec - 1;
          if (bVar12) {
            (result->mVerts).
            super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 (result->mVerts).
                 super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish + (-1 - (ulong)local_ec);
            local_ec = 0xffffffff;
          }
        }
        else {
          __position._M_current =
               (result->mVertcnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_finish;
          if (__position._M_current ==
              (result->mVertcnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_int,std::allocator<unsigned_int>>::
            _M_realloc_insert<unsigned_int_const&>(local_48,__position,&local_ec);
          }
          else {
            *__position._M_current = local_ec;
            ppuVar2 = &(result->mVertcnt).
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_finish;
            *ppuVar2 = *ppuVar2 + 1;
          }
        }
      }
      local_e8 = (ulong)((int)local_e8 + *puVar22);
      puVar22 = puVar22 + 1;
    } while (puVar22 != local_40);
  }
  LogFunctions<Assimp::IFCImporter>::LogDebug((char *)0x5d4e55);
  return;
}

Assistant:

void ProcessBooleanHalfSpaceDifference(const Schema_2x3::IfcHalfSpaceSolid* hs, TempMesh& result,
    const TempMesh& first_operand,
    ConversionData& /*conv*/)
{
    ai_assert(hs != NULL);

    const Schema_2x3::IfcPlane* const plane = hs->BaseSurface->ToPtr<Schema_2x3::IfcPlane>();
    if(!plane) {
        IFCImporter::LogError("expected IfcPlane as base surface for the IfcHalfSpaceSolid");
        return;
    }

    // extract plane base position vector and normal vector
    IfcVector3 p,n(0.f,0.f,1.f);
    if (plane->Position->Axis) {
        ConvertDirection(n,plane->Position->Axis.Get());
    }
    ConvertCartesianPoint(p,plane->Position->Location);

    if(!IsTrue(hs->AgreementFlag)) {
        n *= -1.f;
    }

    // clip the current contents of `meshout` against the plane we obtained from the second operand
    const std::vector<IfcVector3>& in = first_operand.mVerts;
    std::vector<IfcVector3>& outvert = result.mVerts;

    std::vector<unsigned int>::const_iterator begin = first_operand.mVertcnt.begin(),
        end = first_operand.mVertcnt.end(), iit;

    outvert.reserve(in.size());
    result.mVertcnt.reserve(first_operand.mVertcnt.size());

    unsigned int vidx = 0;
    for(iit = begin; iit != end; vidx += *iit++) {

        unsigned int newcount = 0;
        bool isAtWhiteSide = (in[vidx] - p) * n > -1e-6;
        for( unsigned int i = 0; i < *iit; ++i ) {
            const IfcVector3& e0 = in[vidx + i], e1 = in[vidx + (i + 1) % *iit];

            // does the next segment intersect the plane?
            IfcVector3 isectpos;
            if( IntersectSegmentPlane(p, n, e0, e1, isAtWhiteSide, isectpos) ) {
                if( isAtWhiteSide ) {
                    // e0 is on the right side, so keep it
                    outvert.push_back(e0);
                    outvert.push_back(isectpos);
                    newcount += 2;
                }
                else {
                    // e0 is on the wrong side, so drop it and keep e1 instead
                    outvert.push_back(isectpos);
                    ++newcount;
                }
                isAtWhiteSide = !isAtWhiteSide;
            }
            else
            {
                if( isAtWhiteSide ) {
                    outvert.push_back(e0);
                    ++newcount;
                }
            }
        }

        if (!newcount) {
            continue;
        }

        IfcVector3 vmin,vmax;
        ArrayBounds(&*(outvert.end()-newcount),newcount,vmin,vmax);

        // filter our IfcFloat points - those may happen if a point lies
        // directly on the intersection line. However, due to IfcFloat
        // precision a bitwise comparison is not feasible to detect
        // this case.
        const IfcFloat epsilon = (vmax-vmin).SquareLength() / 1e6f;
        FuzzyVectorCompare fz(epsilon);

        std::vector<IfcVector3>::iterator e = std::unique( outvert.end()-newcount, outvert.end(), fz );

        if (e != outvert.end()) {
            newcount -= static_cast<unsigned int>(std::distance(e,outvert.end()));
            outvert.erase(e,outvert.end());
        }
        if (fz(*( outvert.end()-newcount),outvert.back())) {
            outvert.pop_back();
            --newcount;
        }
        if(newcount > 2) {
            result.mVertcnt.push_back(newcount);
        }
        else while(newcount-->0) {
            result.mVerts.pop_back();
        }

    }
    IFCImporter::LogDebug("generating CSG geometry by plane clipping (IfcBooleanClippingResult)");
}